

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_sdot_idx_h_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  long *plVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  
  uVar11 = desc * 8 & 0xff;
  uVar6 = uVar11 + 8;
  uVar8 = (ulong)uVar6;
  iVar12 = (int)desc >> 10;
  uVar13 = 0;
  do {
    lVar9 = (long)*(short *)((long)vm + uVar13 * 8 + (long)iVar12 * 8);
    lVar15 = (long)*(short *)((long)vm + uVar13 * 8 + (long)iVar12 * 8 + 2);
    lVar14 = (long)*(short *)((long)vm + uVar13 * 8 + (long)iVar12 * 8 + 4);
    lVar10 = (long)*(short *)((long)vm + uVar13 * 8 + (long)iVar12 * 8 + 6);
    sVar2 = *(short *)((long)vn + uVar13 * 8 + 8);
    sVar3 = *(short *)((long)vn + uVar13 * 8 + 10);
    sVar4 = *(short *)((long)vn + uVar13 * 8 + 0xc);
    sVar5 = *(short *)((long)vn + uVar13 * 8 + 0xe);
    plVar1 = (long *)((long)vd + uVar13 * 8);
    *plVar1 = *plVar1 + *(short *)((long)vn + uVar13 * 8 + 6) * lVar10 +
                        *(short *)((long)vn + uVar13 * 8 + 4) * lVar14 +
                        *(short *)((long)vn + uVar13 * 8 + 2) * lVar15 +
                        *(short *)((long)vn + uVar13 * 8) * lVar9;
    plVar1 = (long *)((long)vd + uVar13 * 8 + 8);
    *plVar1 = *plVar1 + sVar5 * lVar10 + sVar4 * lVar14 + sVar3 * lVar15 + sVar2 * lVar9;
    uVar13 = uVar13 + 2;
  } while (uVar13 < uVar6 >> 3);
  uVar6 = desc >> 2 & 0xf8;
  if (uVar11 < uVar6) {
    uVar7 = (ulong)(uVar6 + 8);
    uVar13 = uVar8 + 8;
    if (uVar8 + 8 < uVar7) {
      uVar13 = uVar7;
    }
    memset((void *)((long)vd + uVar8),0,(~uVar8 + uVar13 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_sdot_idx_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc), opr_sz_8 = opr_sz / 8;
    intptr_t index = simd_data(desc);
    uint64_t *d = vd;
    int16_t *n = vn;
    int16_t *m_indexed = (int16_t *)vm + index * 4;

    /* This is supported by SVE only, so opr_sz is always a multiple of 16.
     * Process the entire segment all at once, writing back the results
     * only after we've consumed all of the inputs.
     */
    for (i = 0; i < opr_sz_8 ; i += 2) {
        uint64_t d0, d1;

        d0  = n[i * 4 + 0] * (int64_t)m_indexed[i * 4 + 0];
        d0 += n[i * 4 + 1] * (int64_t)m_indexed[i * 4 + 1];
        d0 += n[i * 4 + 2] * (int64_t)m_indexed[i * 4 + 2];
        d0 += n[i * 4 + 3] * (int64_t)m_indexed[i * 4 + 3];
        d1  = n[i * 4 + 4] * (int64_t)m_indexed[i * 4 + 0];
        d1 += n[i * 4 + 5] * (int64_t)m_indexed[i * 4 + 1];
        d1 += n[i * 4 + 6] * (int64_t)m_indexed[i * 4 + 2];
        d1 += n[i * 4 + 7] * (int64_t)m_indexed[i * 4 + 3];

        d[i + 0] += d0;
        d[i + 1] += d1;
    }

    clear_tail(d, opr_sz, simd_maxsz(desc));
}